

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

void cmFortranModuleAppendUpperLower(string *mod,string *mod_upper,string *mod_lower)

{
  bool bVar1;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  bVar1 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(mod,(char (*) [5])".mod");
  if (!bVar1) {
    cmHasLiteralSuffix<std::__cxx11::string,6ul>(mod,(char (*) [6])".smod");
  }
  std::__cxx11::string::substr((ulong)&local_40,(ulong)mod);
  std::__cxx11::string::substr((ulong)&local_60,(ulong)mod);
  cmsys::SystemTools::UpperCase(&local_a0,&local_40);
  std::operator+(&local_80,&local_a0,&local_60);
  std::__cxx11::string::append((string *)mod_upper);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::append((string *)mod_lower);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

static void cmFortranModuleAppendUpperLower(std::string const& mod,
                                            std::string& mod_upper,
                                            std::string& mod_lower)
{
  std::string::size_type ext_len = 0;
  if (cmHasLiteralSuffix(mod, ".mod")) {
    ext_len = 4;
  } else if (cmHasLiteralSuffix(mod, ".smod")) {
    ext_len = 5;
  }
  std::string const& name = mod.substr(0, mod.size() - ext_len);
  std::string const& ext = mod.substr(mod.size() - ext_len);
  mod_upper += cmSystemTools::UpperCase(name) + ext;
  mod_lower += mod;
}